

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

void Gia_ManTerStatePrint(uint *pState,int nRegs,int iNum)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  undefined8 local_38;
  
  printf(" %4d : ",(ulong)(uint)iNum);
  uVar1 = 0;
  local_38 = 0;
  if (0 < nRegs) {
    bVar2 = 0;
    uVar1 = 0;
    local_38 = 0;
    uVar3 = 0;
    do {
      switch(pState[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) {
      case 0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTsim.c"
                      ,0x1e9,"void Gia_ManTerStatePrint(unsigned int *, int, int)");
      case 1:
        putchar(0x30);
        local_38 = CONCAT44(local_38._4_4_ + 1,(int)local_38);
        break;
      case 2:
        putchar(0x31);
        uVar1 = uVar1 + 1;
        break;
      case 3:
        putchar(0x78);
        local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
      }
      uVar3 = uVar3 + 1;
      bVar2 = bVar2 + 2;
    } while (nRegs != uVar3);
  }
  printf(" (0=%4d, 1=%4d, x=%4d)\n",local_38 >> 0x20,(ulong)uVar1,local_38 & 0xffffffff);
  return;
}

Assistant:

void Gia_ManTerStatePrint( unsigned * pState, int nRegs, int iNum )
{
    int i, nZeros = 0, nOnes = 0, nDcs = 0;
    printf( " %4d : ", iNum );
    for ( i = 0; i < nRegs; i++ )
    {
        if ( Gia_ManTerSimInfoGet(pState, i) == GIA_ZER )
            printf( "0" ), nZeros++;
        else if ( Gia_ManTerSimInfoGet(pState, i) == GIA_ONE )
            printf( "1" ), nOnes++;
        else if ( Gia_ManTerSimInfoGet(pState, i) == GIA_UND )
            printf( "x" ), nDcs++;
        else
            assert( 0 );
    }
    printf( " (0=%4d, 1=%4d, x=%4d)\n", nZeros, nOnes, nDcs );
}